

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DetonationPdu.cpp
# Opt level: O2

int __thiscall DIS::DetonationPdu::getMarshalledSize(DetonationPdu *this)

{
  undefined8 *puVar1;
  pointer pAVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  ArticulationParameter listElement;
  
  iVar3 = WarfareFamilyPdu::getMarshalledSize(&this->super_WarfareFamilyPdu);
  iVar4 = EntityID::getMarshalledSize(&this->_munitionID);
  iVar5 = EventID::getMarshalledSize(&this->_eventID);
  iVar6 = Vector3Float::getMarshalledSize(&this->_velocity);
  iVar7 = Vector3Double::getMarshalledSize(&this->_locationInWorldCoordinates);
  iVar8 = BurstDescriptor::getMarshalledSize(&this->_burstDescriptor);
  iVar9 = Vector3Float::getMarshalledSize(&this->_locationInEntityCoordinates);
  iVar3 = iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar9 + 4;
  lVar11 = 8;
  uVar10 = 0;
  while( true ) {
    pAVar2 = (this->_articulationParameters).
             super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(this->_articulationParameters).
                       super__Vector_base<DIS::ArticulationParameter,_std::allocator<DIS::ArticulationParameter>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pAVar2) / 0x18) <= uVar10)
    break;
    listElement._vptr_ArticulationParameter = (_func_int **)&PTR__ArticulationParameter_001b0588;
    puVar1 = (undefined8 *)((long)&pAVar2->_vptr_ArticulationParameter + lVar11);
    listElement._8_8_ = *puVar1;
    listElement._parameterValue = (double)puVar1[1];
    iVar4 = ArticulationParameter::getMarshalledSize(&listElement);
    iVar3 = iVar3 + iVar4;
    ArticulationParameter::~ArticulationParameter(&listElement);
    uVar10 = uVar10 + 1;
    lVar11 = lVar11 + 0x18;
  }
  return iVar3;
}

Assistant:

int DetonationPdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = WarfareFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _munitionID.getMarshalledSize();  // _munitionID
   marshalSize = marshalSize + _eventID.getMarshalledSize();  // _eventID
   marshalSize = marshalSize + _velocity.getMarshalledSize();  // _velocity
   marshalSize = marshalSize + _locationInWorldCoordinates.getMarshalledSize();  // _locationInWorldCoordinates
   marshalSize = marshalSize + _burstDescriptor.getMarshalledSize();  // _burstDescriptor
   marshalSize = marshalSize + _locationInEntityCoordinates.getMarshalledSize();  // _locationInEntityCoordinates
   marshalSize = marshalSize + 1;  // _detonationResult
   marshalSize = marshalSize + 1;  // _numberOfArticulationParameters
   marshalSize = marshalSize + 2;  // _pad

   for(unsigned long long idx=0; idx < _articulationParameters.size(); idx++)
   {
        ArticulationParameter listElement = _articulationParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}